

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

PermuteLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_permute(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x136) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x136;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    PermuteLayerParams::PermuteLayerParams(this_00.permute_);
    (this->layer_).permute_ = (PermuteLayerParams *)this_00;
  }
  return (PermuteLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::PermuteLayerParams* NeuralNetworkLayer::mutable_permute() {
  if (!has_permute()) {
    clear_layer();
    set_has_permute();
    layer_.permute_ = new ::CoreML::Specification::PermuteLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.permute)
  return layer_.permute_;
}